

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

bool tcu::anyNotEqual<float,2>(Vector<float,_2> *a,Vector<float,_2> *b)

{
  bool bVar1;
  bool bVar2;
  int i;
  long lVar3;
  
  bVar1 = false;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    bVar2 = !bVar1;
    bVar1 = true;
    if (bVar2) {
      bVar1 = b->m_data[lVar3] != a->m_data[lVar3];
    }
  }
  return bVar1;
}

Assistant:

inline bool anyNotEqual (const Vector<T, Size>& a, const Vector<T, Size>& b)
{
	bool res = false;
	for (int i = 0; i < Size; i++)
		res = res || a.m_data[i] != b.m_data[i];
	return res;
}